

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  int iVar6;
  pointer ppTVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  TestCase *this_00;
  uint uVar12;
  ulong uVar13;
  pointer ppEVar14;
  long lVar15;
  byte bVar16;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar17;
  timeval now;
  timeval local_58;
  uint local_48;
  int local_44;
  long local_40;
  undefined8 local_38;
  undefined8 uVar18;
  
  if (g_init_gtest_count == 0) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar16 = 0;
  }
  else {
    bVar16 = 1;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      local_44 = FilterTests(this,(uint)!bVar5);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar10 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar10 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            iVar10 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8) >> 7)
                     - (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),0xc) >> 0x1f)
                     ) + (int)local_58.tv_sec * 1000;
          }
          iVar10 = (iVar10 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar10;
        pTVar2 = (this->listeners_).repeater_;
        gettimeofday(&local_58,(__timezone_ptr_t)0x0);
        this->start_timestamp_ =
             local_58.tv_usec / 1000 + CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) * 1000;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
        uVar12 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar12 = FLAGS_gtest_repeat;
        }
        if (uVar12 == 0) {
          bVar16 = 1;
        }
        else {
          uVar13 = 0;
          uVar18 = 0;
          local_48 = uVar12;
          do {
            ppTVar3 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_38 = uVar18;
            for (ppTVar7 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar7 != ppTVar3;
                ppTVar7 = ppTVar7 + 1) {
              TestCase::ClearResult(*ppTVar7);
            }
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_usec),8);
            local_40 = CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec);
            if (local_44 < 1) {
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar13);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar13);
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
              ppEVar17 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar14 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar14 != ppEVar17;
                  ppEVar14 = ppEVar14 + 1) {
                (**(code **)(*(long *)*ppEVar14 + 0x10))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
              bVar5 = Test::HasFatalFailure();
              if ((!bVar5) &&
                 (ppTVar7 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7)
                          >> 3))) {
                lVar15 = 0;
                do {
                  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  if ((lVar15 < (int)((ulong)((long)(this->test_case_indices_).
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_finish -
                                             (long)piVar4) >> 2)) &&
                     (lVar9 = (long)piVar4[lVar15], -1 < lVar9)) {
                    this_00 = ppTVar7[lVar9];
                  }
                  else {
                    this_00 = (TestCase *)0x0;
                  }
                  TestCase::Run(this_00);
                  lVar15 = lVar15 + 1;
                  ppTVar7 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar15 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar7) >> 3));
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])
                        (pTVar2,this->parent_);
              ppEVar14 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar17 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish; ppEVar17 != ppEVar14;
                  ppEVar17 = ppEVar17 + -1) {
                (**(code **)(*(long *)ppEVar17[-1] + 0x18))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
            }
            gettimeofday(&local_58,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_58.tv_sec._4_4_,(int)local_58.tv_sec) - local_40) * 1000 +
                 local_58.tv_usec / 1000 + ((lVar11 >> 7) - (lVar11 >> 0x3f));
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar2,this->parent_,uVar13);
            bVar5 = Passed(this);
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar10 = this->random_seed_;
              if (0x1869e < iVar10 - 1U) {
                GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                                   ,0x22a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition 1 <= seed && seed <= kMaxRandomSeed failed. ",0x36);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Invalid random seed ",0x14);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," - must be in [1, ",0x12)
                ;
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,99999);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"].",2);
                GTestLog::~GTestLog((GTestLog *)&local_58);
              }
              iVar6 = iVar10 + 1;
              if (0x1869e < iVar10) {
                iVar6 = 1;
              }
              this->random_seed_ = iVar6;
            }
            bVar16 = (byte)local_38 | !bVar5;
            uVar18 = CONCAT71((int7)((ulong)local_38 >> 8),bVar16);
            uVar12 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar12;
          } while (uVar12 != local_48 || (int)local_48 < 0);
          bVar16 = bVar16 ^ 1;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      }
    }
  }
  return (bool)(bVar16 & 1);
}

Assistant:

static bool GTestIsInitialized() { return g_init_gtest_count != 0; }